

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O3

void __thiscall blockchain_tests::num_chain_tx_max::test_method(num_chain_tx_max *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined8 local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined1 *local_128;
  undefined1 **local_120;
  undefined8 *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined1 *local_100;
  undefined8 **local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  undefined1 local_c8 [80];
  undefined8 local_78 [9];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_c8,0,0x98);
  local_78[0] = 0xffffffffffffffff;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000075;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = 0xffffffffffffffff;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_e8 = "";
  local_f8 = &local_118;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_01388f48;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01388f48;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined1 *)&local_188;
  local_118 = local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_180,1,2,REQUIRE,0xe4063c,(size_t)&local_f0,0x75,&local_110,
             "std::numeric_limits<uint64_t>::max()",&local_138);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(num_chain_tx_max)
{
    CBlockIndex block_index{};
    block_index.m_chain_tx_count = std::numeric_limits<uint64_t>::max();
    BOOST_CHECK_EQUAL(block_index.m_chain_tx_count, std::numeric_limits<uint64_t>::max());
}